

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_min_a_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  lVar3 = (ulong)wd * 0x10;
  lVar5 = (ulong)ws * 0x10;
  lVar4 = (ulong)wt * 0x10;
  uVar1 = (env->active_fpu).fpr[ws].fs[0];
  uVar6 = (env->active_fpu).fpr[wt].fs[0];
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar7 = -uVar6;
  if (0 < (int)uVar6) {
    uVar7 = uVar6;
  }
  if (uVar2 < uVar7) {
    uVar6 = uVar1;
  }
  (env->active_fpu).fpr[wd].fs[0] = uVar6;
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar5 + 4);
  uVar6 = *(uint *)((long)(env->active_fpu).fpr + lVar4 + 4);
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar7 = -uVar6;
  if (0 < (int)uVar6) {
    uVar7 = uVar6;
  }
  if (uVar2 < uVar7) {
    uVar6 = uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + lVar3 + 4) = uVar6;
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar5 + 8);
  uVar6 = *(uint *)((long)(env->active_fpu).fpr + lVar4 + 8);
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar7 = -uVar6;
  if (0 < (int)uVar6) {
    uVar7 = uVar6;
  }
  if (uVar2 < uVar7) {
    uVar6 = uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + lVar3 + 8) = uVar6;
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + lVar5 + 0xc);
  uVar6 = *(uint *)((long)(env->active_fpu).fpr + lVar4 + 0xc);
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar7 = -uVar6;
  if (0 < (int)uVar6) {
    uVar7 = uVar6;
  }
  if (uVar2 < uVar7) {
    uVar6 = uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + lVar3 + 0xc) = uVar6;
  return;
}

Assistant:

void helper_msa_min_a_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_min_a_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_min_a_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_min_a_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_min_a_df(DF_WORD, pws->w[3],  pwt->w[3]);
}